

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O2

_Bool upb_FileDef_Resolves(upb_FileDef *f,char *path)

{
  _Bool _Var1;
  int iVar2;
  upb_FileDef *f_00;
  bool bVar3;
  int i;
  
  iVar2 = strcmp(f->name,path);
  if (iVar2 == 0) {
    bVar3 = true;
  }
  else {
    iVar2 = 0;
    do {
      bVar3 = iVar2 < f->public_dep_count;
      if (f->public_dep_count <= iVar2) {
        return bVar3;
      }
      f_00 = upb_FileDef_PublicDependency(f,iVar2);
      _Var1 = upb_FileDef_Resolves(f_00,path);
      iVar2 = iVar2 + 1;
    } while (!_Var1);
  }
  return bVar3;
}

Assistant:

bool upb_FileDef_Resolves(const upb_FileDef* f, const char* path) {
  if (!strcmp(f->name, path)) return true;

  for (int i = 0; i < upb_FileDef_PublicDependencyCount(f); i++) {
    const upb_FileDef* dep = upb_FileDef_PublicDependency(f, i);
    if (upb_FileDef_Resolves(dep, path)) return true;
  }
  return false;
}